

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Mode __thiscall
Catch::Clara::Parser::handleOpt
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong in_RCX;
  char in_DL;
  Mode *in_RDI;
  Token *in_R8;
  size_t j;
  string optName;
  undefined4 in_stack_fffffffffffffe98;
  Type in_stack_fffffffffffffe9c;
  Token *in_stack_fffffffffffffea0;
  string local_d8 [72];
  ulong local_90;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  Token *local_30;
  ulong local_28;
  char local_19;
  Mode local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_19 = in_DL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,":=",3,&local_51);
  lVar2 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_19);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (lVar2 == -1) {
    local_4 = *in_RDI;
  }
  else {
    std::__cxx11::string::substr((ulong)local_88,local_28);
    if (*in_RDI == ShortOpt) {
      for (local_90 = 0; uVar1 = local_90, uVar3 = std::__cxx11::string::size(), uVar1 < uVar3;
          local_90 = local_90 + 1) {
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_88);
        Token::Token(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,(string *)0x1b6115);
        std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
        push_back((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                   *)in_stack_fffffffffffffea0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        Token::~Token((Token *)0x1b6138);
        std::__cxx11::string::~string(local_d8);
      }
    }
    else if ((*in_RDI == SlashOpt) && (lVar2 = std::__cxx11::string::size(), lVar2 == 1)) {
      Token::Token(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,(string *)0x1b6206);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *
                )in_stack_fffffffffffffea0,
                (value_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      Token::~Token((Token *)0x1b6223);
    }
    else {
      Token::Token(local_30,in_stack_fffffffffffffe9c,(string *)0x1b626c);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *
                )local_30,
                (value_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      Token::~Token((Token *)0x1b6289);
    }
    local_4 = None;
    std::__cxx11::string::~string(local_88);
  }
  return local_4;
}

Assistant:

Mode handleOpt( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( std::string( ":=\0", 3 ).find( c ) == std::string::npos )
                return mode;

            std::string optName = arg.substr( from, i-from );
            if( mode == ShortOpt )
                for( std::size_t j = 0; j < optName.size(); ++j )
                    tokens.push_back( Token( Token::ShortOpt, optName.substr( j, 1 ) ) );
            else if( mode == SlashOpt && optName.size() == 1 )
                tokens.push_back( Token( Token::ShortOpt, optName ) );
            else
                tokens.push_back( Token( Token::LongOpt, optName ) );
            return None;
        }